

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  undefined8 *puVar23;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype wr;
  sunrealtype wl;
  sunrealtype w;
  sunrealtype vr;
  sunrealtype vl;
  sunrealtype v;
  sunrealtype ur;
  sunrealtype ul;
  sunrealtype u;
  sunrealtype awconst;
  sunrealtype avconst;
  sunrealtype auconst;
  sunrealtype dwconst;
  sunrealtype dvconst;
  sunrealtype duconst;
  sunrealtype *dYdata;
  sunrealtype *Ydata;
  sunrealtype dx;
  sunrealtype aw;
  sunrealtype av;
  sunrealtype au;
  sunrealtype dw;
  sunrealtype dv;
  sunrealtype du;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunindextype N;
  UserData udata;
  undefined8 in_stack_fffffffffffffee8;
  int opt;
  long lVar24;
  char *in_stack_fffffffffffffef0;
  void *in_stack_fffffffffffffef8;
  int local_4;
  
  lVar20 = *in_RDX;
  dVar1 = (double)in_RDX[2];
  dVar2 = (double)in_RDX[3];
  dVar3 = (double)in_RDX[0xb];
  dVar4 = (double)in_RDX[5];
  dVar5 = (double)in_RDX[6];
  dVar6 = (double)in_RDX[7];
  dVar7 = (double)in_RDX[8];
  dVar8 = (double)in_RDX[9];
  dVar9 = (double)in_RDX[10];
  dVar10 = (double)in_RDX[1];
  lVar22 = N_VGetArrayPointer(in_RDI);
  opt = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  iVar21 = check_retval(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,opt);
  if (iVar21 == 0) {
    puVar23 = (undefined8 *)N_VGetArrayPointer(in_RSI);
    iVar21 = check_retval(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,opt);
    if (iVar21 == 0) {
      N_VConst(in_RSI);
      for (lVar24 = 1; lVar24 < lVar20 + -1; lVar24 = lVar24 + 1) {
        dVar11 = *(double *)(lVar22 + lVar24 * 0x18);
        dVar12 = *(double *)(lVar22 + (lVar24 + -1) * 0x18);
        dVar13 = *(double *)(lVar22 + (lVar24 + 1) * 0x18);
        dVar14 = *(double *)(lVar22 + 8 + lVar24 * 0x18);
        dVar15 = *(double *)(lVar22 + 8 + (lVar24 + -1) * 0x18);
        dVar16 = *(double *)(lVar22 + 8 + (lVar24 + 1) * 0x18);
        dVar17 = *(double *)(lVar22 + 0x10 + lVar24 * 0x18);
        dVar18 = *(double *)(lVar22 + 0x10 + (lVar24 + -1) * 0x18);
        dVar19 = *(double *)(lVar22 + 0x10 + (lVar24 + 1) * 0x18);
        puVar23[lVar24 * 3] =
             dVar14 * dVar11 * dVar11 +
             -(dVar17 + 1.0) * dVar11 +
             ((dVar12 - (dVar11 + dVar11)) + dVar13) * ((dVar4 / dVar10) / dVar10) +
             (dVar13 - dVar12) * ((-dVar7 / 2.0) / dVar10) + dVar1;
        puVar23[lVar24 * 3 + 1] =
             -(dVar14 * dVar11) * dVar11 +
             dVar17 * dVar11 +
             ((dVar15 - (dVar14 + dVar14)) + dVar16) * ((dVar5 / dVar10) / dVar10) +
             (dVar16 - dVar15) * ((-dVar8 / 2.0) / dVar10);
        puVar23[lVar24 * 3 + 2] =
             -dVar17 * dVar11 +
             ((dVar18 - (dVar17 + dVar17)) + dVar19) * ((dVar6 / dVar10) / dVar10) +
             (dVar19 - dVar18) * ((-dVar9 / 2.0) / dVar10) + (dVar2 - dVar17) / dVar3;
      }
      puVar23[2] = 0;
      puVar23[1] = 0;
      *puVar23 = 0;
      puVar23[(lVar20 + -1) * 3 + 2] = 0;
      puVar23[(lVar20 + -1) * 3 + 1] = 0;
      puVar23[(lVar20 + -1) * 3] = 0;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype a      = udata->a;
  sunrealtype b      = udata->b;
  sunrealtype ep     = udata->ep;
  sunrealtype du     = udata->du;
  sunrealtype dv     = udata->dv;
  sunrealtype dw     = udata->dw;
  sunrealtype au     = udata->au;
  sunrealtype av     = udata->av;
  sunrealtype aw     = udata->aw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype duconst, dvconst, dwconst, auconst, avconst, awconst, u, ul, ur,
    v, vl, vr, w, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  duconst = du / dx / dx;
  dvconst = dv / dx / dx;
  dwconst = dw / dx / dx;
  auconst = -au / SUN_RCONST(2.0) / dx;
  avconst = -av / SUN_RCONST(2.0) / dx;
  awconst = -aw / SUN_RCONST(2.0) / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u  = Ydata[IDX(i, 0)];
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    v  = Ydata[IDX(i, 1)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    w  = Ydata[IDX(i, 2)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ul - SUN_RCONST(2.0) * u + ur) * duconst +
                        (ur - ul) * auconst + a - (w + SUN_RCONST(1.0)) * u +
                        v * u * u;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vl - SUN_RCONST(2.0) * v + vr) * dvconst +
                        (vr - vl) * avconst + w * u - v * u * u;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wl - SUN_RCONST(2.0) * w + wr) * dwconst +
                        (wr - wl) * awconst + (b - w) / ep - w * u;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}